

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O2

int TIFFAdvanceDirectory(TIFF *tif,uint64_t *nextdiroff,uint64_t *off,tdir_t *nextdirnum)

{
  ulong uVar1;
  uint uVar2;
  tdir_t tVar3;
  int iVar4;
  tmsize_t tVar5;
  toff_t tVar6;
  char *fmt;
  ulong uVar7;
  uint64_t uVar8;
  char *pcVar9;
  uint16_t dircount;
  uint32_t nextdir32;
  undefined4 uStack_34;
  
  iVar4 = _TIFFCheckDirNumberAndOffset(tif,*nextdirnum,*nextdiroff);
  if (iVar4 == 0) {
    TIFFErrorExtR(tif,"TIFFAdvanceDirectory",
                  "Starting directory %u at offset 0x%lx (%lu) might cause an IFD loop",
                  (ulong)*nextdirnum,*nextdiroff,*nextdiroff);
    *nextdiroff = 0;
    *nextdirnum = 0;
    return 0;
  }
  uVar2 = tif->tif_flags;
  if ((uVar2 >> 0xb & 1) == 0) {
    if ((uVar2 >> 0x13 & 1) == 0) {
      iVar4 = _TIFFSeekOK(tif,*nextdiroff);
      pcVar9 = "%s: Error fetching directory count";
      if ((iVar4 == 0) ||
         (tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,&dircount,2), tVar5 != 2)) {
LAB_0024bd71:
        TIFFErrorExtR(tif,"TIFFAdvanceDirectory",pcVar9,tif->tif_name);
        return 0;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&dircount);
      }
      tVar6 = (*tif->tif_seekproc)(tif->tif_clientdata,(ulong)dircount * 0xc,1);
      if (off != (uint64_t *)0x0) {
        *off = tVar6;
      }
      tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,&nextdir32,4);
      if (tVar5 != 4) {
        pcVar9 = "%s: Error fetching directory link";
        goto LAB_0024bd71;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong(&nextdir32);
      }
      uVar8 = (uint64_t)nextdir32;
      *nextdiroff = uVar8;
      goto LAB_0024be03;
    }
    iVar4 = _TIFFSeekOK(tif,*nextdiroff);
    if ((iVar4 == 0) || (tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,&nextdir32,8), tVar5 != 8)
       ) {
      pcVar9 = tif->tif_name;
      fmt = "%s: Error fetching directory count";
LAB_0024bc93:
      TIFFErrorExtR(tif,"TIFFAdvanceDirectory",fmt,pcVar9);
      return 0;
    }
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong8((uint64_t *)&nextdir32);
    }
    if (0xffff < CONCAT44(uStack_34,nextdir32)) goto LAB_0024bc6f;
    tVar6 = (*tif->tif_seekproc)(tif->tif_clientdata,CONCAT44(uStack_34,nextdir32) * 0x14,1);
    if (off != (uint64_t *)0x0) {
      *off = tVar6;
    }
    tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,nextdiroff,8);
    if (tVar5 != 8) {
      pcVar9 = tif->tif_name;
      fmt = "%s: Error fetching directory link";
      goto LAB_0024bc93;
    }
LAB_0024bdf2:
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong8(nextdiroff);
    }
LAB_0024be00:
    uVar8 = *nextdiroff;
LAB_0024be03:
    if (uVar8 == 0) {
      return 1;
    }
    tVar3 = *nextdirnum;
    *nextdirnum = tVar3 + 1;
    iVar4 = _TIFFCheckDirNumberAndOffset(tif,tVar3 + 1,uVar8);
    if (iVar4 == 0) {
      TIFFWarningExtR(tif,"TIFFAdvanceDirectory",
                      "the next directory %u at offset 0x%lx (%lu) might be an IFD loop. Treating directory %d as last directory"
                      ,(ulong)*nextdirnum,*nextdiroff,*nextdiroff,*nextdirnum - 1);
      *nextdiroff = 0;
      *nextdirnum = *nextdirnum - 1;
      return 1;
    }
    return 1;
  }
  uVar7 = *nextdiroff;
  if ((uVar2 >> 0x13 & 1) == 0) {
    if ((0x7ffffffffffffffd < uVar7) || (tif->tif_size < (long)(uVar7 + 2))) {
      TIFFErrorExtR(tif,"TIFFAdvanceDirectory","Error fetching directory count");
      *nextdiroff = 0;
      return 0;
    }
    _TIFFmemcpy(&dircount,tif->tif_base + uVar7,2);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabShort(&dircount);
    }
    uVar7 = (ulong)dircount * 0xc + uVar7 + 2;
    if ((uVar7 < 0x7ffffffffffffffc) && ((long)(uVar7 + 4) <= tif->tif_size)) {
      if (off != (uint64_t *)0x0) {
        *off = uVar7;
      }
      _TIFFmemcpy(&nextdir32,tif->tif_base + uVar7,4);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong(&nextdir32);
      }
      *nextdiroff = (ulong)nextdir32;
      goto LAB_0024be00;
    }
  }
  else {
    if ((0x7ffffffffffffff7 < uVar7) || (uVar1 = uVar7 + 8, tif->tif_size < (long)uVar1)) {
LAB_0024bc6f:
      pcVar9 = "Error fetching directory count";
      goto LAB_0024bdb7;
    }
    _TIFFmemcpy(&nextdir32,tif->tif_base + uVar7,8);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong8((uint64_t *)&nextdir32);
    }
    uVar7 = CONCAT44(uStack_34,nextdir32);
    if (0xffff < uVar7) {
      pcVar9 = "Sanity check on directory count failed";
      goto LAB_0024bdb7;
    }
    if ((uVar1 <= uVar7 * -0x14 + 0x7ffffffffffffff7) &&
       ((long)(uVar7 * 0x14 + uVar1 + 8) <= tif->tif_size)) {
      uVar8 = uVar7 * 0x14 + uVar1;
      if (off != (uint64_t *)0x0) {
        *off = uVar8;
      }
      _TIFFmemcpy(nextdiroff,tif->tif_base + uVar8,8);
      goto LAB_0024bdf2;
    }
  }
  pcVar9 = "Error fetching directory link";
LAB_0024bdb7:
  TIFFErrorExtR(tif,"TIFFAdvanceDirectory",pcVar9);
  return 0;
}

Assistant:

static int TIFFAdvanceDirectory(TIFF *tif, uint64_t *nextdiroff, uint64_t *off,
                                tdir_t *nextdirnum)
{
    static const char module[] = "TIFFAdvanceDirectory";

    /* Add this directory to the directory list, if not already in. */
    if (!_TIFFCheckDirNumberAndOffset(tif, *nextdirnum, *nextdiroff))
    {
        TIFFErrorExtR(tif, module,
                      "Starting directory %u at offset 0x%" PRIx64 " (%" PRIu64
                      ") might cause an IFD loop",
                      *nextdirnum, *nextdiroff, *nextdiroff);
        *nextdiroff = 0;
        *nextdirnum = 0;
        return (0);
    }

    if (isMapped(tif))
    {
        uint64_t poff = *nextdiroff;
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            tmsize_t poffa, poffb, poffc, poffd;
            uint16_t dircount;
            uint32_t nextdir32;
            poffa = (tmsize_t)poff;
            poffb = poffa + sizeof(uint16_t);
            if (((uint64_t)poffa != poff) || (poffb < poffa) ||
                (poffb < (tmsize_t)sizeof(uint16_t)) || (poffb > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                *nextdiroff = 0;
                return (0);
            }
            _TIFFmemcpy(&dircount, tif->tif_base + poffa, sizeof(uint16_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount);
            poffc = poffb + dircount * 12;
            poffd = poffc + sizeof(uint32_t);
            if ((poffc < poffb) || (poffc < dircount * 12) || (poffd < poffc) ||
                (poffd < (tmsize_t)sizeof(uint32_t)) || (poffd > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            if (off != NULL)
                *off = (uint64_t)poffc;
            _TIFFmemcpy(&nextdir32, tif->tif_base + poffc, sizeof(uint32_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&nextdir32);
            *nextdiroff = nextdir32;
        }
        else
        {
            tmsize_t poffa, poffb, poffc, poffd;
            uint64_t dircount64;
            uint16_t dircount16;
            if (poff > (uint64_t)TIFF_TMSIZE_T_MAX - sizeof(uint64_t))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            poffa = (tmsize_t)poff;
            poffb = poffa + sizeof(uint64_t);
            if (poffb > tif->tif_size)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            _TIFFmemcpy(&dircount64, tif->tif_base + poffa, sizeof(uint64_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 0xFFFF)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed");
                return (0);
            }
            dircount16 = (uint16_t)dircount64;
            if (poffb > TIFF_TMSIZE_T_MAX - (tmsize_t)(dircount16 * 20) -
                            (tmsize_t)sizeof(uint64_t))
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            poffc = poffb + dircount16 * 20;
            poffd = poffc + sizeof(uint64_t);
            if (poffd > tif->tif_size)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory link");
                return (0);
            }
            if (off != NULL)
                *off = (uint64_t)poffc;
            _TIFFmemcpy(nextdiroff, tif->tif_base + poffc, sizeof(uint64_t));
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(nextdiroff);
        }
    }
    else
    {
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            uint16_t dircount;
            uint32_t nextdir32;
            if (!SeekOK(tif, *nextdiroff) ||
                !ReadOK(tif, &dircount, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory count",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount);
            if (off != NULL)
                *off = TIFFSeekFile(tif, dircount * 12, SEEK_CUR);
            else
                (void)TIFFSeekFile(tif, dircount * 12, SEEK_CUR);
            if (!ReadOK(tif, &nextdir32, sizeof(uint32_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory link",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&nextdir32);
            *nextdiroff = nextdir32;
        }
        else
        {
            uint64_t dircount64;
            uint16_t dircount16;
            if (!SeekOK(tif, *nextdiroff) ||
                !ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory count",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 0xFFFF)
            {
                TIFFErrorExtR(tif, module, "Error fetching directory count");
                return (0);
            }
            dircount16 = (uint16_t)dircount64;
            if (off != NULL)
                *off = TIFFSeekFile(tif, dircount16 * 20, SEEK_CUR);
            else
                (void)TIFFSeekFile(tif, dircount16 * 20, SEEK_CUR);
            if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module, "%s: Error fetching directory link",
                              tif->tif_name);
                return (0);
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(nextdiroff);
        }
    }
    if (*nextdiroff != 0)
    {
        (*nextdirnum)++;
        /* Check next directory for IFD looping and if so, set it as last
         * directory. */
        if (!_TIFFCheckDirNumberAndOffset(tif, *nextdirnum, *nextdiroff))
        {
            TIFFWarningExtR(
                tif, module,
                "the next directory %u at offset 0x%" PRIx64 " (%" PRIu64
                ") might be an IFD loop. Treating directory %d as "
                "last directory",
                *nextdirnum, *nextdiroff, *nextdiroff, (int)(*nextdirnum) - 1);
            *nextdiroff = 0;
            (*nextdirnum)--;
        }
    }
    return (1);
}